

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluka_reader.cpp
# Opt level: O0

void leggi_bene(ifstream *in,char *da_cercare,char *buff,istringstream *is)

{
  char *pcVar1;
  ulong uVar2;
  ostream *this;
  string *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  allocator local_41;
  string local_40 [32];
  string *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    std::istream::getline(local_8,(long)local_18);
    pcVar1 = strstr(local_18,local_10);
    if (pcVar1 != (char *)0x0) {
      std::ios::clear(local_20 + *(long *)(*(long *)local_20 + -0x18),0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,local_18,&local_41);
      std::__cxx11::istringstream::str(local_20);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      return;
    }
    uVar2 = std::ios::eof();
  } while ((uVar2 & 1) == 0);
  this = std::operator<<((ostream *)&std::cout,anon_var_dwarf_e20);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  exit(0xfa);
}

Assistant:

void leggi_bene(ifstream &in, const char * da_cercare, char * buff, istringstream &is)
{
	while(1)
	{
		in.getline(buff, 1025);
		if(strstr(buff, da_cercare)) break;

		if(in.eof())
		{
			cout << "questo file è una ciofeca" << endl;
			exit(250);
		}
	}

	is.clear();
	is.str(buff);
}